

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmize.c
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  short *psVar2;
  anon_union_8_2_8127e1e2_for_xm_sample_s_11 *paVar3;
  xm_sample_t *pxVar4;
  int8_t *piVar5;
  int iVar6;
  xm_context_t *in_RAX;
  FILE *pFVar7;
  char *__size;
  char *moddata;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  uint32_t rate;
  ulong uVar11;
  char *pcVar12;
  xm_instrument_t *pxVar13;
  xm_context_t **ctxp;
  size_t k;
  ulong uVar14;
  undefined1 auVar15 [16];
  xm_context_t *ctx;
  xm_context_t *local_38;
  
  if (argc < 3) {
    fprintf(_stderr,"Usage: %s [--zero-all-waveforms] <in.xm> <out.libxm>\n",*argv);
LAB_00102953:
    exit(1);
  }
  local_38 = in_RAX;
  fprintf(_stderr,"%s: this format is highly non-portable. Check the README for more information.\n"
          ,*argv);
  pcVar12 = "rb";
  pFVar7 = fopen(argv[(ulong)(uint)argc - 2],"rb");
  if (pFVar7 == (FILE *)0x0) {
    main_cold_8();
LAB_00102965:
    main_cold_1();
LAB_0010296d:
    main_cold_7();
LAB_00102975:
    main_cold_6();
  }
  else {
    pcVar12 = (char *)0x0;
    iVar6 = fseek(pFVar7,0,2);
    if (iVar6 != 0) goto LAB_00102965;
    __size = (char *)ftell(pFVar7);
    moddata = (char *)malloc((size_t)__size);
    if (moddata == (char *)0x0) goto LAB_0010296d;
    rewind(pFVar7);
    pcVar12 = __size;
    sVar8 = fread(moddata,(size_t)__size,1,pFVar7);
    if (sVar8 == 0) goto LAB_00102975;
    xm_create_context_safe(&local_38,moddata,(size_t)__size,48000);
    if (local_38 == (xm_context_t *)0x0) goto LAB_00102953;
    free(moddata);
    pcVar12 = "wb";
    pFVar7 = fopen(argv[(ulong)(uint)argc - 1],"wb");
    if (pFVar7 != (FILE *)0x0) {
      iVar6 = strcmp("--zero-all-waveforms",argv[1]);
      if (iVar6 == 0) {
        main_cold_2();
      }
      if ((local_38->module).num_patterns != 0) {
        lVar9 = 8;
        uVar10 = 0;
        do {
          plVar1 = (long *)((long)&((local_38->module).patterns)->num_rows + lVar9);
          *plVar1 = *plVar1 - (long)local_38;
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar10 < (local_38->module).num_patterns);
      }
      if ((local_38->module).num_instruments != 0) {
        uVar10 = 0;
        do {
          pxVar13 = (local_38->module).instruments;
          if (pxVar13[uVar10].num_samples != 0) {
            uVar11 = 0;
            do {
              pxVar4 = pxVar13[uVar10].samples;
              if (1 < pxVar4[uVar11].length) {
                uVar14 = (ulong)(pxVar4[uVar11].length - 1);
                if (pxVar4[uVar11].bits == '\b') {
                  do {
                    piVar5 = (local_38->module).instruments[uVar10].samples[uVar11].field_11.data8;
                    pcVar12 = piVar5 + uVar14;
                    *pcVar12 = *pcVar12 - piVar5[uVar14 - 1];
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                }
                else {
                  do {
                    psVar2 = (short *)(pxVar4[uVar11].field_11.data8 + uVar14 * 2);
                    *psVar2 = *psVar2 - *(short *)(pxVar4[uVar11].field_11.data8 + uVar14 * 2 + -2);
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                }
              }
              paVar3 = &(local_38->module).instruments[uVar10].samples[uVar11].field_11;
              paVar3->data8 = paVar3->data8 + -(long)local_38;
              uVar11 = uVar11 + 1;
              pxVar13 = (local_38->module).instruments;
            } while (uVar11 < pxVar13[uVar10].num_samples);
          }
          pxVar13[uVar10].samples = (xm_sample_t *)((long)pxVar13[uVar10].samples - (long)local_38);
          uVar10 = uVar10 + 1;
        } while (uVar10 < (local_38->module).num_instruments);
      }
      auVar15._8_4_ = (int)local_38;
      auVar15._0_8_ = local_38;
      auVar15._12_4_ = (int)((ulong)local_38 >> 0x20);
      (local_38->module).patterns =
           (xm_pattern_t *)((long)(local_38->module).patterns - (long)local_38);
      (local_38->module).instruments =
           (xm_instrument_t *)((long)(local_38->module).instruments - auVar15._8_8_);
      local_38->row_loop_count = local_38->row_loop_count + -(long)local_38;
      local_38->channels = (xm_channel_context_t *)((long)local_38->channels - (long)local_38);
      pcVar12 = (char *)local_38->ctx_size;
      sVar8 = fwrite(local_38,(size_t)pcVar12,1,pFVar7);
      if (sVar8 != 0) {
        main_cold_3();
        return 0;
      }
      goto LAB_00102989;
    }
  }
  main_cold_5();
LAB_00102989:
  ctxp = &local_38;
  main_cold_4();
  iVar6 = xm_create_context_safe(ctxp,pcVar12,0xffffffffffffffff,rate);
  return iVar6;
}

Assistant:

int main(int argc, char** argv) {
	xm_context_t* ctx;
	FILE* in;
	FILE* out;
	void* xmdata;
	size_t i, j;

	if(argc < 3) FATAL("Usage: %s [--zero-all-waveforms] <in.xm> <out.libxm>\n", argv[0]);

	fprintf(stderr, "%s: this format is highly non-portable. Check the README for more information.\n", argv[0]);

	in = fopen(argv[argc - 2], "rb");
	if(in == NULL) FATAL("input file %s not readable (fopen)\n", argv[argc - 2]);
	if(fseek(in, 0, SEEK_END)) FATAL("input file %s not seekable\n", argv[argc - 2]);
	xmdata = malloc(i = ftell(in));
	if(xmdata == NULL) FATAL("malloc failed to allocate %lu bytes\n", i);
	rewind(in);
	if(!fread(xmdata, i, 1, in)) FATAL("input file %s not readable (fread)\n", argv[argc - 2]);
	xm_create_context_safe(&ctx, xmdata, i, 48000);
	if(ctx == NULL) exit(1);
	free(xmdata);

	out = fopen(argv[argc - 1], "wb");
	if(out == NULL) FATAL("output file %s not writeable\n", argv[argc - 1]);

	if(!strcmp("--zero-all-waveforms", argv[1])) {
		fprintf(stderr, "%s: zeroing waveforms, saved %lu bytes.\n", argv[0], zero_waveforms(ctx));
	}

	/* Ugly pointer offsetting ahead */

	for(i = 0; i < ctx->module.num_patterns; ++i) {
		OFFSET(ctx->module.patterns[i].slots);
	}

	for(i = 0; i < ctx->module.num_instruments; ++i) {
		for(j = 0; j < ctx->module.instruments[i].num_samples; ++j) {
			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if(ctx->module.instruments[i].samples[j].length > 1) {
					/* Half-ass delta encoding of samples, this compresses
					 * much better */
					if(ctx->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = ctx->module.instruments[i].samples[j].length - 1; k > 0; --k) {
							ctx->module.instruments[i].samples[j].data8[k] -= ctx->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = ctx->module.instruments[i].samples[j].length - 1; k > 0; --k) {
							ctx->module.instruments[i].samples[j].data16[k] -= ctx->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}

			OFFSET(ctx->module.instruments[i].samples[j].data8);
		}

		OFFSET(ctx->module.instruments[i].samples);
	}

	OFFSET(ctx->module.patterns);
	OFFSET(ctx->module.instruments);
	OFFSET(ctx->row_loop_count);
	OFFSET(ctx->channels);

	if(!fwrite(ctx, ctx->ctx_size, 1, out)) FATAL("fwrite() failed writing %lu bytes\n", ctx->ctx_size);
	fclose(out);
	fprintf(stderr, "%s: done writing %lu bytes.\n", argv[0], ctx->ctx_size);

	xm_free_context(ctx);
	return 0;
}